

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int bc_atom_to_idx(BCWriterState *s,uint32_t *pres,JSAtom atom)

{
  BOOL BVar1;
  uint uVar2;
  uint uVar3;
  uint in_EDX;
  uint *in_RSI;
  void **in_RDI;
  int i;
  int old_size;
  uint32_t v;
  int local_28;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar4;
  
  if ((in_EDX < *(uint *)((long)in_RDI + 0x3c)) ||
     (BVar1 = __JS_AtomIsTaggedInt(in_EDX), BVar1 != 0)) {
    *in_RSI = in_EDX;
    iVar4 = 0;
  }
  else {
    uVar2 = in_EDX - *(int *)((long)in_RDI + 0x3c);
    if ((uVar2 < *(uint *)(in_RDI + 9)) && (*(int *)((long)in_RDI[8] + (ulong)uVar2 * 4) != 0)) {
      *in_RSI = *(uint *)((long)in_RDI[8] + (ulong)uVar2 * 4);
      iVar4 = 0;
    }
    else {
      if (*(uint *)(in_RDI + 9) <= uVar2) {
        in_stack_ffffffffffffffdc = *(int *)(in_RDI + 9);
        iVar4 = js_resize_array((JSContext *)
                                CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI
                                ,(int)((ulong)in_RSI >> 0x20),
                                (int *)CONCAT44(uVar2,in_stack_ffffffffffffffe0),
                                in_stack_ffffffffffffffdc);
        local_28 = in_stack_ffffffffffffffdc;
        if (iVar4 != 0) {
          return -1;
        }
        for (; local_28 < *(int *)(in_RDI + 9); local_28 = local_28 + 1) {
          *(undefined4 *)((long)in_RDI[8] + (long)local_28 * 4) = 0;
        }
      }
      iVar4 = js_resize_array((JSContext *)
                              CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                              (int)((ulong)in_RSI >> 0x20),
                              (int *)CONCAT44(uVar2,in_stack_ffffffffffffffe0),
                              in_stack_ffffffffffffffdc);
      if (iVar4 == 0) {
        uVar3 = *(uint *)(in_RDI + 0xb);
        *(uint *)(in_RDI + 0xb) = uVar3 + 1;
        *(uint *)((long)in_RDI[10] + (ulong)uVar3 * 4) = uVar2 + *(int *)((long)in_RDI + 0x3c);
        uVar3 = *(int *)((long)in_RDI + 0x3c) + uVar3;
        *(uint *)((long)in_RDI[8] + (ulong)uVar2 * 4) = uVar3;
        *in_RSI = uVar3;
        iVar4 = 0;
      }
      else {
        *in_RSI = 0;
        iVar4 = -1;
      }
    }
  }
  return iVar4;
}

Assistant:

static int bc_atom_to_idx(BCWriterState *s, uint32_t *pres, JSAtom atom)
{
    uint32_t v;

    if (atom < s->first_atom || __JS_AtomIsTaggedInt(atom)) {
        *pres = atom;
        return 0;
    }
    atom -= s->first_atom;
    if (atom < s->atom_to_idx_size && s->atom_to_idx[atom] != 0) {
        *pres = s->atom_to_idx[atom];
        return 0;
    }
    if (atom >= s->atom_to_idx_size) {
        int old_size, i;
        old_size = s->atom_to_idx_size;
        if (js_resize_array(s->ctx, (void **)&s->atom_to_idx,
                            sizeof(s->atom_to_idx[0]), &s->atom_to_idx_size,
                            atom + 1))
            return -1;
        /* XXX: could add a specific js_resize_array() function to do it */
        for(i = old_size; i < s->atom_to_idx_size; i++)
            s->atom_to_idx[i] = 0;
    }
    if (js_resize_array(s->ctx, (void **)&s->idx_to_atom,
                        sizeof(s->idx_to_atom[0]),
                        &s->idx_to_atom_size, s->idx_to_atom_count + 1))
        goto fail;

    v = s->idx_to_atom_count++;
    s->idx_to_atom[v] = atom + s->first_atom;
    v += s->first_atom;
    s->atom_to_idx[atom] = v;
    *pres = v;
    return 0;
 fail:
    *pres = 0;
    return -1;
}